

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElectricGeneratorType::~IfcElectricGeneratorType
          (IfcElectricGeneratorType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)
   &this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x48 = 0x8ef700;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x30 = 0x8ef868;
  this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  HasPropertySets.ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8ef728;
  *(pointer *)
   ((long)&this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
           super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
           super_IfcTypeObject.HasPropertySets + 0x10) = (pointer)(vtable + 0x68);
  *(undefined8 *)
   ((long)&this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
           super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.Tag.ptr + 0x18
   ) = 0x8ef778;
  *(undefined8 *)
   &this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x8ef7a0;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x8ef7c8;
  *(undefined8 *)&this[-1].field_0x1d8 = 0x8ef7f0;
  *(undefined8 *)&this[-1].field_0x1e8 = 0x8ef818;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x8ef840;
  pvVar1 = *(void **)&(this->super_IfcEnergyConversionDeviceType).
                      super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
                      super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x10;
  if ((undefined1 *)pvVar1 !=
      &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
       super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
       super_IfcTypeObject.field_0x20) {
    operator_delete(pvVar1);
  }
  this_00 = (IfcTypeProduct *)
            &this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
             super_IfcTypeObject.field_0x48;
  *(undefined8 *)
   &this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x48 = 0x8efe90;
  *(undefined8 *)
   &(this->super_IfcEnergyConversionDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x30 = 0x8eff58;
  this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  HasPropertySets.ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8efeb8;
  *(pointer *)
   ((long)&this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
           super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
           super_IfcTypeObject.HasPropertySets + 0x10) =
       (pointer)(IfcElementType-in-Assimp::IFC::Schema_2x3::IfcElectricGeneratorType::
                 construction_vtable + 0x68);
  *(undefined8 *)
   ((long)&this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
           super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.Tag.ptr + 0x18
   ) = 0x8eff08;
  *(undefined8 *)
   &this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x8eff30;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.field_0x1a0;
  if (puVar2 != &this[-1].super_IfcEnergyConversionDeviceType.super_IfcDistributionFlowElementType.
                 field_0x1b0) {
    operator_delete(puVar2);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__008ef8a0);
  operator_delete(this_00);
  return;
}

Assistant:

IfcElectricGeneratorType() : Object("IfcElectricGeneratorType") {}